

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_temporary.h
# Opt level: O2

void __thiscall
sc_core::sc_vpool<sc_dt::sc_unsigned_bitref>::sc_vpool
          (sc_vpool<sc_dt::sc_unsigned_bitref> *this,int log2,sc_unsigned_bitref *pool_p)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  long lVar5;
  ulong uVar6;
  
  this->m_pool_i = 0;
  if (pool_p == (sc_unsigned_bitref *)0x0) {
    uVar6 = 1L << ((byte)log2 & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
    uVar3 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar3 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    puVar4 = (ulong *)operator_new__(uVar3);
    *puVar4 = uVar6;
    pool_p = (sc_unsigned_bitref *)(puVar4 + 1);
    lVar5 = 0;
    do {
      *(undefined4 *)((long)puVar4 + lVar5 + 0x10) = 0;
      *(undefined8 *)((long)puVar4 + lVar5 + 0x18) = 0;
      *(undefined ***)((long)puVar4 + lVar5 + 8) = &PTR_concat_clear_data_00263730;
      lVar5 = lVar5 + 0x18;
    } while (uVar6 * 0x18 - lVar5 != 0);
  }
  this->m_pool_p = pool_p;
  this->m_wrap = ~(-1L << ((byte)log2 & 0x3f));
  return;
}

Assistant:

sc_vpool<T>::sc_vpool( int log2, T* pool_p )
  : m_pool_i( 0 )
  , m_pool_p( pool_p ? pool_p : new T[static_cast<std::size_t>(1) << log2] )
  , m_wrap( ~(static_cast<std::size_t>(-1) << log2) )
{
	// if ( log2 > 32 ) SC_REPORT_ERROR(SC_ID_POOL_SIZE_, "");
}